

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O2

TestPartResultReporterInterface ** __thiscall
testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::GetOrCreateValue
          (ThreadLocal<testing::TestPartResultReporterInterface_*> *this)

{
  int iVar1;
  void *pvVar2;
  undefined8 *__pointer;
  ostream *poVar3;
  TestPartResultReporterInterface **ppTVar4;
  GTestLog local_1c;
  
  pvVar2 = pthread_getspecific(this->key_);
  if (pvVar2 == (void *)0x0) {
    __pointer = (undefined8 *)operator_new(0x10);
    *__pointer = &PTR__ThreadLocalValueHolderBase_00148d68;
    ppTVar4 = (TestPartResultReporterInterface **)(__pointer + 1);
    __pointer[1] = this->default_;
    iVar1 = pthread_setspecific(this->key_,__pointer);
    if (iVar1 != 0) {
      GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/googletest/include/gtest/internal/gtest-port.h"
                         ,0x563);
      poVar3 = std::operator<<((ostream *)&std::cerr,"pthread_setspecific(key_, holder_base)");
      poVar3 = std::operator<<(poVar3,"failed with error ");
      std::ostream::operator<<(poVar3,iVar1);
      GTestLog::~GTestLog(&local_1c);
    }
  }
  else {
    ppTVar4 = (TestPartResultReporterInterface **)((long)pvVar2 + 8);
  }
  return ppTVar4;
}

Assistant:

T* GetOrCreateValue() const {
    ThreadLocalValueHolderBase* const holder =
        static_cast<ThreadLocalValueHolderBase*>(pthread_getspecific(key_));
    if (holder != NULL) {
      return CheckedDowncastToActualType<ValueHolder>(holder)->pointer();
    }

    ValueHolder* const new_holder = new ValueHolder(default_);
    ThreadLocalValueHolderBase* const holder_base = new_holder;
    GTEST_CHECK_POSIX_SUCCESS_(pthread_setspecific(key_, holder_base));
    return new_holder->pointer();
  }